

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

void __thiscall
Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare_emplace<Reflection::Struct>
          (StructImpl<Sinclair::ZXSpectrum::State> *this,Struct *t,string *name,size_t count)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>
  *__args;
  Field local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>
  local_68;
  size_t local_28;
  size_t count_local;
  string *name_local;
  Struct *t_local;
  StructImpl<Sinclair::ZXSpectrum::State> *this_local;
  
  local_28 = count;
  count_local = (size_t)name;
  name_local = (string *)t;
  t_local = &this->super_Struct;
  Field::Field(&local_88,(type_info *)&Struct::typeinfo,(long)t - (long)this,8,count);
  std::
  make_pair<std::__cxx11::string_const&,Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>
            (&local_68,name,&local_88);
  std::
  unordered_map<std::__cxx11::string,Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>>>
  ::
  emplace<std::pair<std::__cxx11::string,Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>>
            ((pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_false,_true>,_bool>
              *)&contents__abi_cxx11_,&local_68,__args);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>
  ::~pair(&local_68);
  return;
}

Assistant:

void declare_emplace(Type *t, const std::string &name, size_t count = 1) {
			contents_.emplace(
				std::make_pair(
					name,
					Field(typeid(Type), reinterpret_cast<uint8_t *>(t) - reinterpret_cast<uint8_t *>(this), sizeof(Type), count)
				));
		}